

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

obj * display_cinventory(obj *obj)

{
  char *pcVar1;
  object_pick *local_a8;
  object_pick *selected;
  char local_98 [4];
  int n;
  char tmp [128];
  obj *ret;
  obj *obj_local;
  
  tmp[0x78] = '\0';
  tmp[0x79] = '\0';
  tmp[0x7a] = '\0';
  tmp[0x7b] = '\0';
  tmp[0x7c] = '\0';
  tmp[0x7d] = '\0';
  tmp[0x7e] = '\0';
  tmp[0x7f] = '\0';
  local_a8 = (object_pick *)0x0;
  pcVar1 = doname(obj);
  sprintf(local_98,"Contents of %s:",pcVar1);
  if (obj->cobj == (obj *)0x0) {
    invdisp_nothing(local_98,"(empty)");
    selected._4_4_ = 0;
  }
  else {
    selected._4_4_ = query_objlist(local_98,obj->cobj,8,&local_a8,0,allow_all);
  }
  if (0 < selected._4_4_) {
    tmp._120_8_ = local_a8->obj;
    free(local_a8);
  }
  return (obj *)tmp._120_8_;
}

Assistant:

struct obj *display_cinventory(struct obj *obj)
{
	struct obj *ret = NULL;
	char tmp[QBUFSZ];
	int n;
	struct object_pick *selected = 0;

	sprintf(tmp,"Contents of %s:", doname(obj));

	if (obj->cobj) {
	    n = query_objlist(tmp, obj->cobj, INVORDER_SORT, &selected,
			    PICK_NONE, allow_all);
	} else {
	    invdisp_nothing(tmp, "(empty)");
	    n = 0;
	}
	
	if (n > 0) {
	    ret = selected[0].obj;
	    free(selected);
	}
	
	return ret;
}